

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

void __thiscall
despot::RockSampleMMAPStateScenarioLowerBound::RockSampleMMAPStateScenarioLowerBound
          (RockSampleMMAPStateScenarioLowerBound *this,DSPOMDP *model)

{
  int a;
  Grid<int> *this_00;
  uint uVar1;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *__x;
  int *piVar2;
  ulong uVar3;
  int s;
  ulong uVar4;
  BaseRockSample *this_01;
  int rock;
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> policy;
  int local_6c;
  _Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> local_68;
  ulong local_50;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  despot::ScenarioLowerBound::ScenarioLowerBound(&this->super_ScenarioLowerBound,model);
  *(undefined ***)this = &PTR__RockSampleMMAPStateScenarioLowerBound_0011d8f8;
  this_01 = (BaseRockSample *)(model + -0x38);
  if (model == (DSPOMDP *)0x0) {
    this_01 = (BaseRockSample *)0x0;
  }
  this->rs_model_ = this_01;
  this->grid_ = &this_01->grid_;
  (this->rock_order_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rock_order_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rock_order_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = BaseRockSample::ComputeOptimalSamplingPolicy(this_01);
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
            ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)&local_68,__x);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_48,
           (long)local_68._M_impl.super__Vector_impl_data._M_finish -
           (long)local_68._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_6c)
  ;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_move_assign(&this->rock_order_,&local_48);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  uVar3 = 0;
  do {
    if ((ulong)((long)local_68._M_impl.super__Vector_impl_data._M_finish -
                (long)local_68._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar3) {
      std::_Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::~_Vector_base
                (&local_68);
      return;
    }
    uVar4 = uVar3 & 0xffffffff;
    local_50 = uVar3;
    while( true ) {
      s = (int)uVar4;
      if (((long)local_68._M_impl.super__Vector_impl_data._M_finish -
           (long)local_68._M_impl.super__Vector_impl_data._M_start >> 4) + -1 == (long)s) break;
      a = *(int *)(local_68._M_impl.super__Vector_impl_data._M_start + (long)s * 0x10);
      if (a == 4) {
        this_00 = this->grid_;
        local_48.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)BaseRockSample::IndexToCoord
                                (this->rs_model_,s >> ((byte)this->rs_model_->num_rocks_ & 0x1f));
        piVar2 = Grid<int>::operator()(this_00,(Coord *)&local_48);
        local_6c = *piVar2;
        if (local_6c < 0) {
          exit(0);
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((this->rock_order_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar3,&local_6c);
      }
      uVar1 = BaseRockSample::NextState(this->rs_model_,s,a);
      uVar4 = (ulong)uVar1;
    }
    uVar3 = local_50 + 1;
  } while( true );
}

Assistant:

RockSampleMMAPStateScenarioLowerBound(const DSPOMDP* model) :
		ScenarioLowerBound(model),
		rs_model_(static_cast<const BaseRockSample*>(model)),
		grid_(rs_model_->grid_) {
		const vector<ValuedAction> policy =
			rs_model_->ComputeOptimalSamplingPolicy();
		rock_order_ = vector<vector<int> >(policy.size());
		for (int s = 0; s < policy.size(); s++) {
			int cur = s;
			while (cur != policy.size() - 1) {
				ACT_TYPE action = policy[cur].action;
				if (action == rs_model_->E_SAMPLE) {
					int rock = grid_(
						rs_model_->IndexToCoord(cur >> rs_model_->num_rocks_));
					if (rock < 0)
						exit(0);
					rock_order_[s].push_back(rock);
				}
				cur = rs_model_->NextState(cur, action);
			}
		}
	}